

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_> *
__thiscall
minibag::View::getConnections
          (vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
           *__return_storage_ptr__,View *this)

{
  pointer *pppCVar1;
  pointer ppMVar2;
  iterator __position;
  pointer ppMVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>::
  reserve(__return_storage_ptr__,
          (long)(this->ranges_).
                super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ranges_).
                super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppMVar2 = (this->ranges_).
            super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar3 = (this->ranges_).
                 super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppMVar3 != ppMVar2;
      ppMVar3 = ppMVar3 + 1) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<minibag::ConnectionInfo_const*,std::allocator<minibag::ConnectionInfo_const*>>::
      _M_realloc_insert<minibag::ConnectionInfo_const*const&>
                ((vector<minibag::ConnectionInfo_const*,std::allocator<minibag::ConnectionInfo_const*>>
                  *)__return_storage_ptr__,__position,&(*ppMVar3)->connection_info);
    }
    else {
      *__position._M_current = (*ppMVar3)->connection_info;
      pppCVar1 = &(__return_storage_ptr__->
                  super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const ConnectionInfo*> View::getConnections()
{
  std::vector<const ConnectionInfo*> connections;
  connections.reserve(ranges_.size());

  for (MessageRange* range : ranges_)
  {
    connections.push_back(range->connection_info);
  }

  return connections;
}